

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O1

bool __thiscall FScanner::CheckNumber(FScanner *this)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  char *in_RAX;
  long lVar3;
  char *stopper;
  char *local_28;
  
  local_28 = in_RAX;
  bVar1 = ScanString(this,false);
  if (!bVar1) {
    return false;
  }
  __s1 = this->String;
  if (*__s1 == '\0') {
LAB_00488a4a:
    this->AlreadyGot = true;
    this->AlreadyGotLine = this->LastGotLine;
    bVar1 = false;
  }
  else {
    iVar2 = strcmp(__s1,"MAXINT");
    if (iVar2 == 0) {
      this->Number = 0x7fffffff;
    }
    else {
      lVar3 = strtol(__s1,&local_28,0);
      this->Number = (int)lVar3;
      if (*local_28 != '\0') goto LAB_00488a4a;
    }
    this->Float = (double)this->Number;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool FScanner::CheckNumber ()
{
	char *stopper;

	if (GetString())
	{
		if (String[0] == 0)
		{
			UnGet();
			return false;
		}
		else if (strcmp (String, "MAXINT") == 0)
		{
			Number = INT_MAX;
		}
		else
		{
			Number = strtol (String, &stopper, 0);
			if (*stopper != 0)
			{
				UnGet();
				return false;
			}
		}
		Float = Number;
		return true;
	}
	else
	{
		return false;
	}
}